

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpool_test.cc
# Opt level: O0

void __thiscall
TokenPoolTestImplicitToken::~TokenPoolTestImplicitToken(TokenPoolTestImplicitToken *this)

{
  TokenPoolTestImplicitToken *this_local;
  
  ~TokenPoolTestImplicitToken(this);
  operator_delete(this,0x428);
  return;
}

Assistant:

TEST_F(TokenPoolTest, ImplicitToken) {
  CreateDefaultPool();

  ASSERT_NE(NULL, tokens_);
  EXPECT_EQ(kLoadAverageDefault, load_avg_);

  EXPECT_TRUE(tokens_->Acquire());
  tokens_->Reserve();
  EXPECT_FALSE(tokens_->Acquire());
  tokens_->Release();
  EXPECT_TRUE(tokens_->Acquire());
}